

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

uint __thiscall wasm::Type::hasByteSize(Type *this)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  bool bVar6;
  Iterator IVar7;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  uVar1 = this->id;
  if ((uVar1 & 1) == 0 || uVar1 < 7) {
    bVar6 = uVar1 - 2 < 5;
  }
  else {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_40 = (undefined1  [8])this;
    IVar7 = end(this);
    pTVar4 = (Type *)0x1;
    while (pTVar5 = pTVar4,
          bVar2 = (long)pTVar5 -
                  IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index ==
                  1,
          bVar3 = IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                  == this, bVar6 = bVar2 && bVar3, !bVar2 || !bVar3) {
      pTVar4 = Iterator::operator*((Iterator *)local_40);
      if (4 < pTVar4->id - 2) break;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5;
      pTVar4 = (Type *)((long)&pTVar5->id + 1);
    }
  }
  return (uint)bVar6;
}

Assistant:

unsigned Type::hasByteSize() const {
  auto hasSingleByteSize = [](Type t) { return t.isNumber(); };
  if (isTuple()) {
    for (const auto& t : *this) {
      if (!hasSingleByteSize(t)) {
        return false;
      }
    }
    return true;
  }
  return hasSingleByteSize(*this);
}